

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::constraintSecondPartialDerivativeWRTStateControl
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *lambda,MatrixDynSize *hessian)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *psVar5;
  element_type *peVar6;
  long *plVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  Index size;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  void *__s;
  double dVar14;
  long lVar15;
  long lVar16;
  string *psVar17;
  ostream *poVar18;
  double dVar19;
  ulong uVar20;
  reverse_iterator constraintIterator;
  ostringstream errorMsg;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *local_1d8;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> local_1c8;
  pointer local_1b8;
  double local_1b0;
  pointer local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = time;
  bVar9 = isAnyTimeGroup(this);
  if (!bVar9) {
    uVar11 = iDynTree::VectorDynSize::size();
    iDynTree::VectorDynSize::size();
    iDynTree::MatrixDynSize::resize((ulong)hessian,uVar11);
    psVar5 = (this->m_pimpl->orderedIntervals).
             super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1a8[0] = (this->m_pimpl->orderedIntervals).
                   super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>>,__gnu_cxx::__ops::_Iter_pred<iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::findActiveConstraint(double)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>>
              (SUB84(local_1b0,0),&local_1b8);
    if (local_1b8 !=
        (this->m_pimpl->orderedIntervals).
        super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar15 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      iDynTree::VectorDynSize::size();
      uVar12 = iDynTree::VectorDynSize::data();
      uVar13 = iDynTree::VectorDynSize::size();
      uVar11 = uVar13;
      if (((uVar12 & 7) == 0) &&
         (uVar11 = (ulong)((uint)(uVar12 >> 3) & 1), (long)uVar13 <= (long)uVar11)) {
        uVar11 = uVar13;
      }
      lVar16 = uVar13 - uVar11;
      if (0 < (long)uVar11) {
        uVar20 = 0;
        do {
          *(undefined8 *)(uVar12 + uVar20 * 8) = *(undefined8 *)(lVar15 + uVar20 * 8);
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      uVar20 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
      if (1 < lVar16) {
        do {
          puVar1 = (undefined8 *)(lVar15 + uVar11 * 8);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)(uVar12 + uVar11 * 8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          uVar11 = uVar11 + 2;
        } while ((long)uVar11 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar13) {
        do {
          *(undefined8 *)(uVar12 + uVar20 * 8) = *(undefined8 *)(lVar15 + uVar20 * 8);
          uVar20 = uVar20 + 1;
        } while (uVar13 != uVar20);
      }
      peVar6 = local_1b8[-1].
               super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      plVar7 = *(long **)&peVar6->constraint;
      cVar10 = (**(code **)(*plVar7 + 0x60))
                         (SUB84(local_1b0,0),plVar7,state,control,&peVar6->lambdaBuffer,hessian);
      if (cVar10 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to evaluate ",0x13);
        psVar17 = Constraint::name_abi_cxx11_
                            (*(Constraint **)
                              &(local_1b8[-1].
                                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->constraint);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                             psVar17->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                   (char *)psVar5);
      }
      else {
        lVar15 = iDynTree::MatrixDynSize::rows();
        lVar16 = iDynTree::VectorDynSize::size();
        if (lVar15 == lVar16) {
          lVar15 = iDynTree::MatrixDynSize::cols();
          lVar16 = iDynTree::VectorDynSize::size();
          if (lVar15 == lVar16) {
            return true;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "The second partial derivative WRT state/control of constraint ",0x3e);
          psVar17 = Constraint::name_abi_cxx11_
                              (*(Constraint **)
                                &(local_1b8[-1].
                                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->constraint);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                               psVar17->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18," has a number of columns different from the size of the control.",0x40
                    );
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
          std::ostream::put((char)poVar18);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                     (char *)psVar5);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "The second partial derivative WRT state/control of constraint ",0x3e);
          psVar17 = Constraint::name_abi_cxx11_
                              (*(Constraint **)
                                &(local_1b8[-1].
                                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->constraint);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                               psVar17->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18," has a number of rows different from the size of the state.",0x3b);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
          std::ostream::put((char)poVar18);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                     (char *)psVar5);
        }
      }
      if (psVar5 != &local_1c8) {
        operator_delete(psVar5,(ulong)((long)&((local_1c8.
                                                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->constraint).
                                              super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return false;
    }
    __s = (void *)iDynTree::MatrixDynSize::data();
    lVar15 = iDynTree::MatrixDynSize::rows();
    lVar16 = iDynTree::MatrixDynSize::cols();
    uVar12 = lVar16 * lVar15;
    uVar11 = uVar12;
    if ((((ulong)__s & 7) == 0) &&
       (uVar11 = (ulong)((uint)((ulong)__s >> 3) & 1), (long)uVar12 <= (long)uVar11)) {
      uVar11 = uVar12;
    }
    lVar15 = uVar12 - uVar11;
    if (0 < (long)uVar11) {
      memset(__s,0,uVar11 * 8);
    }
    dVar19 = (double)((lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU) + uVar11);
    if (1 < lVar15) {
      dVar14 = (double)(uVar11 + 2);
      if ((long)(uVar11 + 2) < (long)dVar19) {
        dVar14 = dVar19;
      }
      local_1b0 = dVar19;
      memset((void *)(uVar11 * 8 + (long)__s),0,
             (~uVar11 + (long)dVar14 & 0xfffffffffffffffe) * 8 + 0x10);
      dVar19 = local_1b0;
    }
    if ((long)uVar12 <= (long)dVar19) {
      return true;
    }
    memset((void *)((long)__s + uVar11 * 8 + (lVar15 / 2) * 0x10),0,(lVar15 % 2) * 8);
    return true;
  }
  p_Var3 = (this->m_pimpl->group)._M_h._M_before_begin._M_nxt;
  p_Var4 = p_Var3[5]._M_nxt;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3[6]._M_nxt;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  cVar10 = (*(code *)p_Var4->_M_nxt->_M_nxt[0xc]._M_nxt)
                     (SUB84(local_1b0,0),p_Var4->_M_nxt,state,control,lambda,hessian);
  if (cVar10 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed to evaluate ",0x13);
    psVar17 = Constraint::name_abi_cxx11_((Constraint *)p_Var4->_M_nxt);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,psVar17->_M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
               (char *)local_1d8);
  }
  else {
    lVar15 = iDynTree::MatrixDynSize::rows();
    lVar16 = iDynTree::VectorDynSize::size();
    if (lVar15 == lVar16) {
      lVar15 = iDynTree::MatrixDynSize::cols();
      lVar16 = iDynTree::VectorDynSize::size();
      bVar9 = true;
      if (lVar15 == lVar16) goto LAB_00179374;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The second partial derivative WRT state/control of constraint ",0x3e);
      psVar17 = Constraint::name_abi_cxx11_((Constraint *)p_Var4->_M_nxt);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                           psVar17->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18," has a number of columns different from the size of the control.",0x40);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                 (char *)local_1d8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The second partial derivative WRT state/control of constraint ",0x3e);
      psVar17 = Constraint::name_abi_cxx11_((Constraint *)p_Var4->_M_nxt);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                           psVar17->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18," has a number of rows different from the size of the state.",0x3b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","constraintSecondPartialDerivativeWRTStateControl",
                 (char *)local_1d8);
    }
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,
                    (ulong)((long)&((local_1c8.
                                     super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->constraint).
                                   super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  bVar9 = false;
LAB_00179374:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar9;
}

Assistant:

bool ConstraintsGroup::constraintSecondPartialDerivativeWRTStateControl(double time, const VectorDynSize &state, const VectorDynSize &control, const VectorDynSize &lambda, MatrixDynSize &hessian)
        {
            if (isAnyTimeGroup()){
                TimedConstraint_ptr loneConstraint = m_pimpl->group.begin()->second;
                if (!(loneConstraint->constraint->constraintSecondPartialDerivativeWRTStateControl(time, state, control, lambda, hessian))) {
                    std::ostringstream errorMsg;
                    errorMsg << "Failed to evaluate "<< loneConstraint->constraint->name() << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The second partial derivative WRT state/control of constraint "<< loneConstraint->constraint->name() << " has a number of rows different from the size of the state." << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.cols() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The second partial derivative WRT state/control of constraint "<< loneConstraint->constraint->name() << " has a number of columns different from the size of the control." << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                    return false;
                }

                return true;
            }

            hessian.resize(state.size(), control.size());

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()){ //no active constraint
                toEigen(hessian).setZero();
                return true;
            }

            toEigen(constraintIterator->get()->lambdaBuffer) = toEigen(lambda).topRows(constraintIterator->get()->lambdaBuffer.size());

            if (!(constraintIterator->get()->constraint->constraintSecondPartialDerivativeWRTStateControl(time, state, control, constraintIterator->get()->lambdaBuffer, hessian))) {
                std::ostringstream errorMsg;
                errorMsg << "Failed to evaluate "<< constraintIterator->get()->constraint->name() << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                return false;
            }

            if (hessian.rows() != state.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The second partial derivative WRT state/control of constraint "<< constraintIterator->get()->constraint->name() << " has a number of rows different from the size of the state." << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                return false;
            }

            if (hessian.cols() != control.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The second partial derivative WRT state/control of constraint "<< constraintIterator->get()->constraint->name() << " has a number of columns different from the size of the control." << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                return false;
            }

            return true;
        }